

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-handshake.c
# Opt level: O0

lws * lws_client_reset(lws **pwsi,int ssl,char *address,int port,char *path,char *host,char weak)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t size_00;
  lws *s;
  char *pcVar5;
  char *__s;
  lws *plVar6;
  size_t local_e0;
  int local_6c;
  long lStack_68;
  int n;
  size_t size;
  lws *wsi;
  char *p;
  char *stash;
  _lws_websocket_related *ws;
  char *host_local;
  char *path_local;
  int port_local;
  char *address_local;
  int ssl_local;
  lws **pwsi_local;
  
  lStack_68 = 0;
  if (pwsi != (lws **)0x0) {
    plVar6 = *pwsi;
    _lws_log(0x10,"%s: wsi %p: redir %d: %s\n","lws_client_reset",plVar6,
             (ulong)(uint)(int)plVar6->redirects,address);
    if (plVar6->redirects == '\x03') {
      _lws_log(1,"%s: Too many redirects\n","lws_client_reset");
    }
    else {
      plVar6->redirects = plVar6->redirects + '\x01';
      for (local_6c = 0; local_6c < 5; local_6c = local_6c + 1) {
        iVar1 = lws_hdr_total_length(plVar6,(uint)hnames2[local_6c]);
        lStack_68 = (iVar1 + 1) + lStack_68;
      }
      iVar1 = lws_hdr_total_length(plVar6,_WSI_TOKEN_CLIENT_URI);
      if ((int)lStack_68 < iVar1 + 1) {
        iVar1 = lws_hdr_total_length(plVar6,_WSI_TOKEN_CLIENT_URI);
        lStack_68 = (long)(iVar1 + 1);
      }
      sVar2 = strlen(path);
      sVar3 = strlen(address);
      sVar4 = strlen(host);
      size_00 = sVar2 + sVar3 + sVar4 + 4 + lStack_68;
      s = (lws *)lws_realloc((void *)0x0,size_00,"lws_client_reset");
      if (s != (lws *)0x0) {
        wsi = s;
        for (local_6c = 0; local_6c < 5; local_6c = local_6c + 1) {
          iVar1 = lws_hdr_total_length(plVar6,(uint)hnames2[local_6c]);
          if (iVar1 == 0) {
            *(undefined1 *)&(wsi->http).new_wsi_list = 0;
            wsi = (lws *)((long)&(wsi->http).new_wsi_list + 1);
          }
          else {
            pcVar5 = lws_hdr_simple_ptr(plVar6,(uint)hnames2[local_6c]);
            iVar1 = lws_hdr_total_length(plVar6,(uint)hnames2[local_6c]);
            memcpy(wsi,pcVar5,(long)(iVar1 + 1));
            iVar1 = lws_hdr_total_length(plVar6,(uint)hnames2[local_6c]);
            wsi = (lws *)((wsi->http).multipart_boundary + (long)(iVar1 + 1) + -0x50);
          }
        }
        sVar2 = strlen(address);
        memcpy(wsi,address,sVar2 + 1);
        sVar2 = strlen((char *)wsi);
        pcVar5 = (wsi->http).multipart_boundary + (sVar2 - 0x4f);
        sVar2 = strlen(host);
        memcpy(pcVar5,host,sVar2 + 1);
        sVar2 = strlen(pcVar5);
        __s = pcVar5 + sVar2 + 1;
        sVar2 = strlen(path);
        memcpy(__s,path,sVar2 + 1);
        path_local._4_4_ = port;
        address_local._4_4_ = ssl;
        if (port == 0) {
          _lws_log(8,"%s: forcing port 443\n","lws_client_reset");
          path_local._4_4_ = 0x1bb;
          address_local._4_4_ = 1;
        }
        _lws_log(8,"redirect ads=\'%s\', port=%d, path=\'%s\', ssl = %d, pifds %d\n",wsi,
                 (ulong)path_local._4_4_,__s,(ulong)address_local._4_4_,
                 plVar6->position_in_fds_table);
        __remove_wsi_socket_from_fds(plVar6);
        if (weak != '\0') {
          stash = (char *)plVar6->ws;
          plVar6->ws = (_lws_websocket_related *)0x0;
        }
        __lws_reset_wsi(plVar6);
        if (weak != '\0') {
          plVar6->ws = (_lws_websocket_related *)stash;
        }
        *(ulong *)&plVar6->field_0x2dc =
             *(ulong *)&plVar6->field_0x2dc & 0xffdfffffffffffff | 0x20000000000000;
        lws_ssl_close(plVar6);
        if ((plVar6->role_ops != (lws_role_ops *)0x0) &&
           (plVar6->role_ops->close_kill_connection != (_func_int_lws_ptr_lws_close_status *)0x0)) {
          (*plVar6->role_ops->close_kill_connection)(plVar6,1);
        }
        if (plVar6->context->event_loop_ops->close_handle_manually == (_func_void_lws_ptr *)0x0) {
          if ((plVar6->desc).sockfd != -1) {
            close((plVar6->desc).sockfd);
          }
        }
        else {
          (*plVar6->context->event_loop_ops->close_handle_manually)(plVar6);
        }
        if (address_local._4_4_ == 0) {
          (plVar6->tls).use_ssl = (plVar6->tls).use_ssl & 0xfffffffe;
        }
        else {
          (plVar6->tls).use_ssl = (plVar6->tls).use_ssl | 1;
        }
        if (((plVar6->protocol != (lws_protocols *)0x0) && (plVar6->role_ops != (lws_role_ops *)0x0)
            ) && ((*(ulong *)&plVar6->field_0x2dc >> 0x22 & 1) != 0)) {
          (*plVar6->protocol->callback)
                    (plVar6,(lws_callback_reasons)
                            plVar6->role_ops->protocol_unbind_cb
                            [(int)(uint)((plVar6->wsistate & 0x20000000) != 0)],plVar6->user_space,
                     "lws_client_reset",0);
          *(ulong *)&plVar6->field_0x2dc = *(ulong *)&plVar6->field_0x2dc & 0xfffffffbffffffff;
        }
        (plVar6->desc).sockfd = -1;
        lws_role_transition(plVar6,0x10000000,LRS_UNCONNECTED,&role_ops_h1);
        if (plVar6->protocol != (lws_protocols *)0x0) {
          lws_bind_protocol(plVar6,plVar6->protocol,"client_reset");
        }
        plVar6->pending_timeout = '\0';
        plVar6->c_port = (uint16_t)path_local._4_4_;
        *(ulong *)&plVar6->field_0x2dc = *(ulong *)&plVar6->field_0x2dc & 0xfffffffffffffffe;
        iVar1 = lws_header_table_attach(plVar6,0);
        if (iVar1 == 0) {
          iVar1 = lws_hdr_simple_create(plVar6,_WSI_TOKEN_CLIENT_PEER_ADDRESS,(char *)wsi);
          if ((iVar1 == 0) &&
             (iVar1 = lws_hdr_simple_create(plVar6,_WSI_TOKEN_CLIENT_HOST,pcVar5), iVar1 == 0)) {
            wsi = s;
            for (local_6c = 0; local_6c < 5; local_6c = local_6c + 1) {
              iVar1 = lws_hdr_simple_create(plVar6,(uint)hnames2[local_6c],(char *)wsi);
              if (iVar1 != 0) goto LAB_00136769;
              iVar1 = lws_hdr_total_length(plVar6,(uint)hnames2[local_6c]);
              wsi = (lws *)((wsi->http).multipart_boundary + (long)(iVar1 + 1) + -0x50);
            }
            *(char *)&(s->http).new_wsi_list = '/';
            sVar2 = strlen(__s);
            if (size_00 - 1 < sVar2 + 1) {
              local_e0 = size_00 - 1;
            }
            else {
              local_e0 = strlen(__s);
              local_e0 = local_e0 + 1;
            }
            memmove((char *)((long)&(s->http).new_wsi_list + 1),__s,local_e0);
            iVar1 = lws_hdr_simple_create(plVar6,_WSI_TOKEN_CLIENT_URI,(char *)s);
            if (iVar1 == 0) {
              lws_realloc(s,0,"free");
              if ((*(ulong *)&plVar6->field_0x2dc >> 0x37 & 1) != 0) {
                (plVar6->h2).field_0x11 = (plVar6->h2).field_0x11 & 0xfd;
                (plVar6->h2).field_0x11 = (plVar6->h2).field_0x11 & 0xfe;
              }
              plVar6 = lws_client_connect_2_dnsreq(plVar6);
              *pwsi = plVar6;
              return *pwsi;
            }
          }
        }
        else {
          _lws_log(1,"%s: failed to get ah\n","lws_client_reset");
        }
LAB_00136769:
        lws_realloc(s,0,"free");
      }
    }
  }
  return (lws *)0x0;
}

Assistant:

struct lws *
lws_client_reset(struct lws **pwsi, int ssl, const char *address, int port,
		 const char *path, const char *host, char weak)
{
#if defined(LWS_ROLE_WS)
	struct _lws_websocket_related *ws;
#endif
	char *stash, *p;
	struct lws *wsi;
	size_t size = 0;
	int n;

	if (!pwsi)
		return NULL;

	wsi = *pwsi;

	lwsl_debug("%s: wsi %p: redir %d: %s\n", __func__, wsi, wsi->redirects,
			address);

	if (wsi->redirects == 3) {
		lwsl_err("%s: Too many redirects\n", __func__);
		return NULL;
	}
	wsi->redirects++;

	/*
	 * goal is to close our role part, close the sockfd, detach the ah
	 * but leave our wsi extant and still bound to whatever vhost it was
	 */

	for (n = 0; n < (int)LWS_ARRAY_SIZE(hnames2); n++)
		size += lws_hdr_total_length(wsi, hnames2[n]) + 1;

	if ((int)size < lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_URI) + 1)
		size = lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_URI) + 1;

	/*
	 * The incoming address and host can be from inside the existing ah
	 * we are going to detach and reattch
	 */

	size += strlen(path) + 1 + strlen(address) + 1 + strlen(host) + 1 + 1;

	p = stash = lws_malloc(size, __func__);
	if (!stash)
		return NULL;

	/*
	 * _WSI_TOKEN_CLIENT_ORIGIN,
	 * _WSI_TOKEN_CLIENT_SENT_PROTOCOLS,
	 * _WSI_TOKEN_CLIENT_METHOD,
	 * _WSI_TOKEN_CLIENT_IFACE,
	 * _WSI_TOKEN_CLIENT_ALPN
	 * address
	 * host
	 * path
	 */

	for (n = 0; n < (int)LWS_ARRAY_SIZE(hnames2); n++)
		if (lws_hdr_total_length(wsi, hnames2[n])) {
			memcpy(p, lws_hdr_simple_ptr(wsi, hnames2[n]),
				lws_hdr_total_length(wsi, hnames2[n]) + 1);
			p += lws_hdr_total_length(wsi, hnames2[n]) + 1;
		} else
			*p++ = '\0';

	memcpy(p, address, strlen(address) + 1);
	address = p;
	p += strlen(address) + 1;
	memcpy(p, host, strlen(host) + 1);
	host = p;
	p += strlen(host) + 1;
	memcpy(p, path, strlen(path) + 1);
	path = p;

	if (!port) {
		lwsl_info("%s: forcing port 443\n", __func__);

		port = 443;
		ssl = 1;
	}

	lwsl_info("redirect ads='%s', port=%d, path='%s', ssl = %d, pifds %d\n",
		   address, port, path, ssl, wsi->position_in_fds_table);

	__remove_wsi_socket_from_fds(wsi);
#if defined(LWS_ROLE_WS)
	if (weak) {
		ws = wsi->ws;
		wsi->ws = NULL;
	}
#endif
	__lws_reset_wsi(wsi); /* detaches ah here */
#if defined(LWS_ROLE_WS)
	if (weak)
		wsi->ws = ws;
#endif
	wsi->client_pipeline = 1;

	/* close the connection by hand */

#if defined(LWS_WITH_TLS)
	lws_ssl_close(wsi);
#endif

	if (wsi->role_ops && wsi->role_ops->close_kill_connection)
		wsi->role_ops->close_kill_connection(wsi, 1);

	if (wsi->context->event_loop_ops->close_handle_manually)
		wsi->context->event_loop_ops->close_handle_manually(wsi);
	else
		if (wsi->desc.sockfd != LWS_SOCK_INVALID)
			compatible_close(wsi->desc.sockfd);

#if defined(LWS_WITH_TLS)
	if (!ssl)
		wsi->tls.use_ssl &= ~LCCSCF_USE_SSL;
	else
		wsi->tls.use_ssl |= LCCSCF_USE_SSL;
#else
	if (ssl) {
		lwsl_err("%s: not configured for ssl\n", __func__);
		goto bail;
	}
#endif

	if (wsi->protocol && wsi->role_ops && wsi->protocol_bind_balance) {
		wsi->protocol->callback(wsi,
				wsi->role_ops->protocol_unbind_cb[
				       !!lwsi_role_server(wsi)],
				       wsi->user_space, (void *)__func__, 0);

		wsi->protocol_bind_balance = 0;
	}

	wsi->desc.sockfd = LWS_SOCK_INVALID;
	lws_role_transition(wsi, LWSIFR_CLIENT, LRS_UNCONNECTED, &role_ops_h1);
//	wsi->protocol = NULL;
	if (wsi->protocol)
		lws_bind_protocol(wsi, wsi->protocol, "client_reset");
	wsi->pending_timeout = NO_PENDING_TIMEOUT;
	wsi->c_port = port;
	wsi->hdr_parsing_completed = 0;

	if (lws_header_table_attach(wsi, 0)) {
		lwsl_err("%s: failed to get ah\n", __func__);
		goto bail;
	}
	//_lws_header_table_reset(wsi->http.ah);

	if (lws_hdr_simple_create(wsi, _WSI_TOKEN_CLIENT_PEER_ADDRESS, address))
		goto bail;

	if (lws_hdr_simple_create(wsi, _WSI_TOKEN_CLIENT_HOST, host))
		goto bail;

	/*
	 * _WSI_TOKEN_CLIENT_ORIGIN,
	 * _WSI_TOKEN_CLIENT_SENT_PROTOCOLS,
	 * _WSI_TOKEN_CLIENT_METHOD,
	 * _WSI_TOKEN_CLIENT_IFACE,
	 * _WSI_TOKEN_CLIENT_ALPN
	 * address
	 * host
	 * path
	 */

	p = stash;
	for (n = 0; n < (int)LWS_ARRAY_SIZE(hnames2); n++) {
		if (lws_hdr_simple_create(wsi, hnames2[n], p))
			goto bail;
		p += lws_hdr_total_length(wsi, hnames2[n]) + 1;
	}

	stash[0] = '/';
	memmove(&stash[1], path, size - 1 < strlen(path) + 1 ? size - 1 : strlen(path) + 1);
	if (lws_hdr_simple_create(wsi, _WSI_TOKEN_CLIENT_URI, stash))
		goto bail;

	lws_free_set_NULL(stash);

#if defined(LWS_WITH_HTTP2)
	if (wsi->client_mux_substream)
		wsi->h2.END_STREAM = wsi->h2.END_HEADERS = 0;
#endif

	*pwsi = lws_client_connect_2_dnsreq(wsi);

	return *pwsi;

bail:
	lws_free_set_NULL(stash);

	return NULL;
}